

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

void mbedtls_debug_print_buf
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,uchar *buf,
               size_t len)

{
  uchar uVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  char txt [17];
  char str [512];
  
  if (((ssl->conf != (mbedtls_ssl_config *)0x0) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    snprintf(str,0x200,"dumping \'%s\' (%u bytes)\n",text,len & 0xffffffff);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,str);
    txt[0] = '\0';
    txt[1] = '\0';
    txt[2] = '\0';
    txt[3] = '\0';
    txt[4] = '\0';
    txt[5] = '\0';
    txt[6] = '\0';
    txt[7] = '\0';
    txt[8] = '\0';
    txt[9] = '\0';
    txt[10] = '\0';
    txt[0xb] = '\0';
    txt[0xc] = '\0';
    txt[0xd] = '\0';
    txt[0xe] = '\0';
    txt[0xf] = '\0';
    txt[0x10] = '\0';
    uVar5 = 0x1000;
    if (len < 0x1000) {
      uVar5 = len;
    }
    bVar4 = -(char)uVar5;
    lVar6 = 0;
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      if ((uVar3 & 0xf) == 0) {
        if (uVar3 != 0) {
          snprintf(str + lVar6,0x200 - lVar6,"  %s\n",txt);
          (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,str);
          txt[0] = '\0';
          txt[1] = '\0';
          txt[2] = '\0';
          txt[3] = '\0';
          txt[4] = '\0';
          txt[5] = '\0';
          txt[6] = '\0';
          txt[7] = '\0';
          txt[8] = '\0';
          txt[9] = '\0';
          txt[10] = '\0';
          txt[0xb] = '\0';
          txt[0xc] = '\0';
          txt[0xd] = '\0';
          txt[0xe] = '\0';
          txt[0xf] = '\0';
          txt[0x10] = '\0';
          lVar6 = 0;
        }
        iVar2 = snprintf(str + lVar6,0x200 - lVar6,"%04x: ",uVar3 & 0xffffffff);
        lVar6 = lVar6 + iVar2;
      }
      iVar2 = snprintf(str + lVar6,0x200 - lVar6," %02x",(ulong)buf[uVar3]);
      lVar6 = lVar6 + iVar2;
      uVar1 = buf[uVar3];
      if (0x5e < (byte)(uVar1 - 0x20)) {
        uVar1 = '.';
      }
      txt[uVar3 & 0xf] = uVar1;
      bVar4 = bVar4 + 1;
    }
    if (len != 0) {
      while( true ) {
        if ((bVar4 & 0xf) == ((byte)uVar5 & 0xf)) break;
        iVar2 = snprintf(str + lVar6,0x200U - lVar6,"   ");
        lVar6 = lVar6 + iVar2;
        uVar5 = uVar5 + 1;
      }
      snprintf(str + lVar6,0x200U - lVar6,"  %s\n",txt);
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,str);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_buf( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line, const char *text,
                      const unsigned char *buf, size_t len )
{
    char str[DEBUG_BUF_SIZE];
    char txt[17];
    size_t i, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "dumping '%s' (%u bytes)\n",
              text, (unsigned int) len );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    memset( txt, 0, sizeof( txt ) );
    for( i = 0; i < len; i++ )
    {
        if( i >= 4096 )
            break;

        if( i % 16 == 0 )
        {
            if( i > 0 )
            {
                mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
                debug_send_line( ssl, level, file, line, str );

                idx = 0;
                memset( txt, 0, sizeof( txt ) );
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "%04x: ",
                             (unsigned int) i );

        }

        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x",
                         (unsigned int) buf[i] );
        txt[i % 16] = ( buf[i] > 31 && buf[i] < 127 ) ? buf[i] : '.' ;
    }

    if( len > 0 )
    {
        for( /* i = i */; i % 16 != 0; i++ )
            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "   " );

        mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
        debug_send_line( ssl, level, file, line, str );
    }
}